

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O3

int endswith(char *str,char *postfix)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  
  sVar1 = strlen(str);
  if (str <= str + (sVar1 - 1)) {
    pcVar2 = str + (sVar1 - 2);
    pcVar3 = "/.";
    do {
      if (pcVar2[1] != pcVar3[1]) {
        return 0;
      }
      if (pcVar2 < str) {
        return 1;
      }
      pcVar2 = pcVar2 + -1;
      bVar4 = "" < pcVar3;
      pcVar3 = pcVar3 + -1;
    } while (bVar4);
  }
  return 1;
}

Assistant:

static int
endswith(const char * str, const char * postfix)
{
    const char * p = str + strlen(str) - 1;
    const char * q = postfix + strlen(postfix) - 1;
    for(; p >= str && q >= postfix; p --, q--) {
        if(*p != *q) return 0;
    }
    return 1;
}